

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::weibull_dist<double>::operator()(weibull_dist<double> *this,lcg64_shift *r)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (this->P).theta_;
  dVar2 = utility::u01xx_traits<double,_1UL,_trng::lcg64_shift>::oc(r);
  dVar2 = log(dVar2);
  dVar2 = pow(-dVar2,1.0 / (this->P).beta_);
  return dVar2 * dVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return P.theta() * math::pow(-math::ln(utility::uniformoc<result_type>(r)), 1 / P.beta());
    }